

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffiblk(fitsfile *fptr,long nblock,int headdata,int *status)

{
  int iVar1;
  LONGLONG *pLVar2;
  undefined1 *puVar3;
  int iVar4;
  undefined1 *buffer;
  byte bVar5;
  FITSfile *pFVar6;
  long lVar7;
  uint __c;
  LONGLONG bytepos;
  undefined1 *buffer_00;
  long lVar8;
  int typhdu;
  char card [81];
  char buff2 [2880];
  char buff1 [2880];
  int local_171c;
  char local_1718 [96];
  undefined1 local_16b8 [2880];
  undefined1 local_b78 [2888];
  
  iVar4 = *status;
  if (nblock < 1 || 0 < iVar4) {
    return iVar4;
  }
  pFVar6 = fptr->Fptr;
  if (headdata == 0) {
    bytepos = pFVar6->datastart;
    __c = 0x20;
LAB_00183067:
    memset(local_16b8,__c,0xb40);
    if (nblock == 1) {
LAB_001830d2:
      ffmbyt(fptr,bytepos,0,status);
      ffgbyt(fptr,0xb40,local_b78,status);
      if (*status < 1) {
        puVar3 = local_16b8;
        buffer = local_b78;
        do {
          buffer_00 = buffer;
          buffer = puVar3;
          ffmbyt(fptr,bytepos,0,status);
          ffpbyt(fptr,0xb40,buffer,status);
          if (0 < *status) {
            return *status;
          }
          bytepos = bytepos + 0xb40;
          ffmbyt(fptr,bytepos,0,status);
          ffgbyt(fptr,0xb40,buffer,status);
          puVar3 = buffer_00;
        } while (*status < 1);
      }
      else {
        buffer_00 = local_16b8;
      }
      *status = iVar4;
      ffmbyt(fptr,bytepos,1,status);
      ffpbyt(fptr,0xb40,buffer_00,status);
      goto LAB_00183310;
    }
  }
  else {
    bVar5 = (pFVar6->hdutype == 1) << 5;
    if (headdata != -1) {
      bytepos = ((pFVar6->heapstart + pFVar6->datastart + pFVar6->heapsize + 0xb3f) / 0xb40) * 0xb40
      ;
      __c = (uint)bVar5;
      goto LAB_00183067;
    }
    builtin_strncpy(local_1718 + 0x20,"IMAGE extension",0x10);
    builtin_strncpy(local_1718 + 0x10,"   \'          / ",0x10);
    builtin_strncpy(local_1718,"XTENSION= \'IMAGE",0x10);
    memset(local_16b8,(uint)bVar5,0xb40);
    if (nblock == 1) {
      ffmrec(fptr,1,local_1718,status);
      bytepos = 0;
      goto LAB_001830d2;
    }
    bytepos = 0;
  }
  iVar1 = pFVar6->curhdu;
  do {
    ffmahd(fptr,fptr->HDUposition + 2,&local_171c,status);
  } while (*status < 1);
  if (*status == 0x6b) {
    *status = iVar4;
  }
  ffmahd(fptr,iVar1 + 1,&local_171c,status);
  if (headdata == -1) {
    ffmrec(fptr,1,local_1718,status);
  }
  lVar8 = fptr->Fptr->headstart[(long)fptr->Fptr->maxhdu + 1];
  if (0xb3f < lVar8 - bytepos) {
    lVar7 = (lVar8 - bytepos) / 0xb40;
    do {
      lVar8 = lVar8 + -0xb40;
      iVar4 = ffmbyt(fptr,lVar8,0,status);
      if (0 < iVar4) goto LAB_00183358;
      ffgbyt(fptr,0xb40,local_b78,status);
      ffmbyt(fptr,nblock * 0xb40 + lVar8,1,status);
      ffpbyt(fptr,0xb40,local_b78,status);
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  ffmbyt(fptr,bytepos,1,status);
  lVar8 = nblock;
  do {
    ffpbyt(fptr,0xb40,local_16b8,status);
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
LAB_00183310:
  if (headdata == 0) {
    pFVar6 = fptr->Fptr;
    pFVar6->datastart = pFVar6->datastart + nblock * 0xb40;
  }
  else {
    pFVar6 = fptr->Fptr;
  }
  iVar4 = pFVar6->maxhdu;
  if (pFVar6->curhdu <= iVar4) {
    pLVar2 = pFVar6->headstart;
    lVar8 = (long)pFVar6->curhdu + -1;
    do {
      pLVar2[lVar8 + 2] = pLVar2[lVar8 + 2] + nblock * 0xb40;
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar4);
  }
LAB_00183358:
  return *status;
}

Assistant:

int ffiblk(fitsfile *fptr,      /* I - FITS file pointer               */
           long nblock,         /* I - no. of blocks to insert         */ 
           int headdata,        /* I - insert where? 0=header, 1=data  */
                                /*     -1=beginning of file            */
           int *status)         /* IO - error status                   */
/*
   insert 2880-byte blocks at the end of the current header or data unit
*/
{
    int tstatus, savehdu, typhdu;
    LONGLONG insertpt, jpoint;
    long ii, nshift;
    char charfill;
    char buff1[2880], buff2[2880];
    char *inbuff, *outbuff, *tmpbuff;
    char card[FLEN_CARD];

    if (*status > 0 || nblock <= 0)
        return(*status);
        
    tstatus = *status;

    if (headdata == 0 || (fptr->Fptr)->hdutype == ASCII_TBL)
        charfill = 32;  /* headers and ASCII tables have space (32) fill */
    else
        charfill = 0;   /* images and binary tables have zero fill */

    if (headdata == 0)  
        insertpt = (fptr->Fptr)->datastart;  /* insert just before data, or */
    else if (headdata == -1)
    {
        insertpt = 0;
        strcpy(card, "XTENSION= 'IMAGE   '          / IMAGE extension");
    }
    else                                     /* at end of data, */
    {
        insertpt = (fptr->Fptr)->datastart + 
                   (fptr->Fptr)->heapstart + 
                   (fptr->Fptr)->heapsize;
        insertpt = ((insertpt + 2879) / 2880) * 2880; /* start of block */

       /* the following formula is wrong because the current data unit
          may have been extended without updating the headstart value
          of the following HDU.
       */
       /* insertpt = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu + 1]; */
    }

    inbuff  = buff1;   /* set pointers to input and output buffers */
    outbuff = buff2;

    memset(outbuff, charfill, 2880); /* initialize buffer with fill */

    if (nblock == 1)  /* insert one block */
    {
      if (headdata == -1)
        ffmrec(fptr, 1, card, status);    /* change SIMPLE -> XTENSION */

      ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* move to 1st point */
      ffgbyt(fptr, 2880, inbuff, status);  /* read first block of bytes */

      while (*status <= 0)
      {
        ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* insert point */
        ffpbyt(fptr, 2880, outbuff, status);  /* write the output buffer */

        if (*status > 0)
            return(*status);

        tmpbuff = inbuff;   /* swap input and output pointers */
        inbuff = outbuff;
        outbuff = tmpbuff;
        insertpt += 2880;  /* increment insert point by 1 block */

        ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* move to next block */
        ffgbyt(fptr, 2880, inbuff, status);  /* read block of bytes */
      }

      *status = tstatus;  /* reset status value */
      ffmbyt(fptr, insertpt, IGNORE_EOF, status); /* move back to insert pt */
      ffpbyt(fptr, 2880, outbuff, status);  /* write the final block */
    }

    else   /*  inserting more than 1 block */

    {
        savehdu = (fptr->Fptr)->curhdu;  /* save the current HDU number */
        tstatus = *status;
        while(*status <= 0)  /* find the last HDU in file */
              ffmrhd(fptr, 1, &typhdu, status);

        if (*status == END_OF_FILE)
        {
            *status = tstatus;
        }

        ffmahd(fptr, savehdu + 1, &typhdu, status);  /* move back to CHDU */
        if (headdata == -1)
          ffmrec(fptr, 1, card, status); /* NOW change SIMPLE -> XTENSION */

        /* number of 2880-byte blocks that have to be shifted down */
        nshift = (long) (((fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1] - insertpt)
                 / 2880);
        /* position of last block in file to be shifted */
        jpoint =  (fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1] - 2880;

        /* move all the blocks starting at end of file working backwards */
        for (ii = 0; ii < nshift; ii++)
        {
            /* move to the read start position */
            if (ffmbyt(fptr, jpoint, REPORT_EOF, status) > 0)
                return(*status);

            ffgbyt(fptr, 2880, inbuff,status);  /* read one record */

            /* move forward to the write postion */
            ffmbyt(fptr, jpoint + ((LONGLONG) nblock * 2880), IGNORE_EOF, status);

            ffpbyt(fptr, 2880, inbuff, status);  /* write the record */

            jpoint -= 2880;
        }

        /* move back to the write start postion (might be EOF) */
        ffmbyt(fptr, insertpt, IGNORE_EOF, status);

        for (ii = 0; ii < nblock; ii++)   /* insert correct fill value */
             ffpbyt(fptr, 2880, outbuff, status);
    }

    if (headdata == 0)         /* update data start address */
      (fptr->Fptr)->datastart += ((LONGLONG) nblock * 2880);

    /* update following HDU addresses */
    for (ii = (fptr->Fptr)->curhdu; ii <= (fptr->Fptr)->maxhdu; ii++)
         (fptr->Fptr)->headstart[ii + 1] += ((LONGLONG) nblock * 2880);

    return(*status);
}